

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

int Abc_NtkFinSimOneBit(Abc_Obj_t *pObj,int Type,Vec_Wrd_t *vSims,int nWords,int iBit)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Mio_Library_t *pLib;
  int *piVar3;
  int iVar4;
  Mio_Gate_t *pGate;
  uint uVar5;
  uint uVar6;
  word *pwVar7;
  long lVar8;
  word *pwVar9;
  long lVar10;
  bool bVar11;
  int iBits [6];
  uint local_28 [6];
  
  pAVar2 = pObj->pNtk;
  if (pAVar2->ntkFunc == ABC_FUNC_MAP) {
    bVar11 = pAVar2->ntkType == ABC_NTK_LOGIC;
  }
  else {
    bVar11 = false;
  }
  iVar4 = iBit >> 5;
  if ((-1 < Type) && (bVar11)) {
    pLib = (Mio_Library_t *)pAVar2->pManFunc;
    lVar8 = (long)(pObj->vFanins).nSize;
    if (0 < lVar8) {
      piVar3 = (pObj->vFanins).pArray;
      lVar10 = 0;
      do {
        uVar6 = piVar3[lVar10] * nWords;
        if (((int)uVar6 < 0) || (vSims->nSize <= (int)uVar6)) goto LAB_002b349e;
        local_28[lVar10] =
             (uint)((*(uint *)((long)vSims->pArray + (long)iVar4 * 4 + (ulong)uVar6 * 8) >>
                     (iBit & 0x1fU) & 1) != 0);
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    pGate = Mio_LibraryReadGateById(pLib,Type);
    iVar4 = Mio_LibGateSimulateOne(pGate,(int *)local_28);
    return iVar4;
  }
  iVar1 = (pObj->vFanins).nSize;
  if (iVar1 < 1) {
    pwVar9 = (word *)0x0;
  }
  else {
    uVar6 = *(pObj->vFanins).pArray * nWords;
    if (((int)uVar6 < 0) || (vSims->nSize <= (int)uVar6)) goto LAB_002b349e;
    pwVar9 = vSims->pArray + uVar6;
  }
  if (iVar1 < 2) {
    pwVar7 = (word *)0x0;
  }
  else {
    uVar6 = nWords * (pObj->vFanins).pArray[1];
    if (((int)uVar6 < 0) || (vSims->nSize <= (int)uVar6)) {
LAB_002b349e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pwVar7 = vSims->pArray + uVar6;
  }
  uVar5 = 0xffffffff;
  uVar6 = 0xffffffff;
  if (0 < iVar1) {
    uVar6 = (uint)((*(uint *)((long)pwVar9 + (long)iVar4 * 4) >> (iBit & 0x1fU) & 1) != 0);
  }
  if (1 < iVar1) {
    uVar5 = (uint)((*(uint *)((long)pwVar7 + (long)iVar4 * 4) >> (iBit & 0x1fU) & 1) != 0);
  }
  switch(Type) {
  case -99:
    uVar6 = 0;
    break;
  case -0x62:
    uVar6 = 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x2a5,"int Abc_NtkFinSimOneBit(Abc_Obj_t *, int, Vec_Wrd_t *, int, int)");
  case -0x60:
    uVar6 = uVar6 & uVar5;
    break;
  case -0x5f:
    bVar11 = (uVar5 & uVar6) == 0;
    goto LAB_002b3492;
  case -0x5e:
    uVar6 = uVar6 | uVar5;
    break;
  case -0x5d:
    bVar11 = uVar5 == 0 && uVar6 == 0;
    goto LAB_002b3492;
  case -0x5c:
    uVar6 = uVar6 ^ uVar5;
    break;
  case -0x5b:
    bVar11 = uVar6 == uVar5;
LAB_002b3492:
    uVar6 = (uint)bVar11;
    break;
  case -0x5a:
    uVar6 = (uint)(uVar6 == 0);
    break;
  case -0x59:
    break;
  }
  return uVar6;
}

Assistant:

static inline int Abc_NtkFinSimOneBit( Abc_Obj_t * pObj, int Type, Vec_Wrd_t * vSims, int nWords, int iBit )
{
    if ( Abc_NtkIsMappedLogic(pObj->pNtk) && Type >= 0 )
    {
        extern int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] );
        Mio_Library_t * pLib = (Mio_Library_t *)pObj->pNtk->pManFunc;
        int i, iBits[6];
        for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        {
            word * pSim0 = Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId(pObj, i) );
            iBits[i] = Abc_InfoHasBit( (unsigned*)pSim0, iBit );
        }
        return Mio_LibGateSimulateOne( Mio_LibraryReadGateById(pLib, Type), iBits );
    }
    else
    {
        word * pSim0 = Abc_ObjFaninNum(pObj) > 0 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId0(pObj) ) : NULL;
        word * pSim1 = Abc_ObjFaninNum(pObj) > 1 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId1(pObj) ) : NULL;
        int iBit0 = Abc_ObjFaninNum(pObj) > 0 ? Abc_InfoHasBit( (unsigned*)pSim0, iBit ) : -1;
        int iBit1 = Abc_ObjFaninNum(pObj) > 1 ? Abc_InfoHasBit( (unsigned*)pSim1, iBit ) : -1;
        assert( Type != ABC_FIN_NEG );
        if ( Type == ABC_FIN_SA0 )            return 0;
        if ( Type == ABC_FIN_SA1 )            return 1;
        if ( Type == ABC_FIN_RDOB_BUFF )      return iBit0;
        if ( Type == ABC_FIN_RDOB_NOT )       return !iBit0;
        if ( Type == ABC_FIN_RDOB_AND )       return iBit0 & iBit1;
        if ( Type == ABC_FIN_RDOB_OR )        return iBit0 | iBit1;
        if ( Type == ABC_FIN_RDOB_XOR )       return iBit0 ^ iBit1;
        if ( Type == ABC_FIN_RDOB_NAND )      return !(iBit0 & iBit1);
        if ( Type == ABC_FIN_RDOB_NOR )       return !(iBit0 | iBit1);
        if ( Type == ABC_FIN_RDOB_NXOR )      return !(iBit0 ^ iBit1);
        assert( 0 );
        return -1;
    }
}